

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,false,false,false,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  sel_t sVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (count + 0x3f < 0x40) {
    lVar9 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar9 = 0;
    uVar13 = 0;
    uVar14 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar8 = count;
        }
LAB_0042677c:
        uVar6 = uVar14;
        if (uVar14 < uVar8) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          uVar10 = uVar14 << 4 | 8;
          do {
            uVar6 = uVar14;
            if (psVar2 != (sel_t *)0x0) {
              uVar6 = (ulong)psVar2[uVar14];
            }
            uVar7 = *(ulong *)((long)ldata + (uVar10 - 8));
            lVar4 = *(long *)((long)&ldata->lower + uVar10);
            lVar5 = *(long *)((long)&rdata->lower + uVar10);
            uVar11 = *(ulong *)((long)rdata + (uVar10 - 8));
            psVar3[lVar9] = (sel_t)uVar6;
            lVar9 = lVar9 + (ulong)((uVar7 <= uVar11 || lVar4 != lVar5) && lVar4 <= lVar5);
            uVar14 = uVar14 + 1;
            uVar10 = uVar10 + 0x10;
            uVar6 = uVar8;
          } while (uVar8 != uVar14);
        }
      }
      else {
        uVar10 = puVar1[uVar13];
        uVar8 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar8 = count;
        }
        if (uVar10 == 0xffffffffffffffff) goto LAB_0042677c;
        uVar6 = uVar8;
        if (uVar10 == 0) {
          if (uVar14 < uVar8) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              sVar12 = (sel_t)uVar14;
              if (psVar2 != (sel_t *)0x0) {
                sVar12 = psVar2[uVar14];
              }
              psVar3[lVar9] = sVar12;
              lVar9 = lVar9 + 1;
              uVar14 = uVar14 + 1;
            } while (uVar8 != uVar14);
          }
        }
        else {
          uVar6 = uVar14;
          if (uVar14 < uVar8) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            uVar11 = uVar14 << 4 | 8;
            uVar7 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar12 = (int)uVar14 + (int)uVar7;
              }
              else {
                sVar12 = psVar2[uVar14 + uVar7];
              }
              if ((uVar10 >> (uVar7 & 0x3f) & 1) == 0) {
                uVar6 = 1;
              }
              else {
                lVar4 = *(long *)((long)&ldata->lower + uVar11);
                lVar5 = *(long *)((long)&rdata->lower + uVar11);
                uVar6 = (ulong)((*(ulong *)((long)ldata + (uVar11 - 8)) <=
                                 *(ulong *)((long)rdata + (uVar11 - 8)) || lVar4 != lVar5) &&
                               lVar4 <= lVar5);
              }
              psVar3[lVar9] = sVar12;
              lVar9 = lVar9 + uVar6;
              uVar7 = uVar7 + 1;
              uVar11 = uVar11 + 0x10;
              uVar6 = uVar8;
            } while (uVar8 - uVar14 != uVar7);
          }
        }
      }
      uVar13 = uVar13 + 1;
      uVar14 = uVar6;
    } while (uVar13 != count + 0x3f >> 6);
  }
  return count - lVar9;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}